

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void textfont_cb(Fl_Choice *i,void *v)

{
  int iVar1;
  Fl_Widget_Type *q;
  Fl_Type *o;
  int mod;
  Fl_Color c;
  int s;
  Fl_Font n;
  void *v_local;
  Fl_Choice *i_local;
  
  _s = v;
  v_local = i;
  if ((char *)v == "LOAD") {
    iVar1 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x2b])
                      (current_widget,0,&c,&mod,(long)&o + 4);
    if (iVar1 == 0) {
      Fl_Widget::deactivate((Fl_Widget *)v_local);
    }
    else {
      Fl_Widget::activate((Fl_Widget *)v_local);
      if (0xf < (int)c) {
        c = 0;
      }
      Fl_Choice::value((Fl_Choice *)v_local,c);
    }
  }
  else {
    o._0_4_ = 0;
    c = Fl_Choice::value(i);
    for (q = (Fl_Widget_Type *)Fl_Type::first; q != (Fl_Widget_Type *)0x0;
        q = (Fl_Widget_Type *)(q->super_Fl_Type).next) {
      if (((q->super_Fl_Type).selected != '\0') &&
         (iVar1 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar1 != 0)) {
        (*(q->super_Fl_Type)._vptr_Fl_Type[0x2b])(q,1,&c,&mod,(long)&o + 4);
        Fl_Widget::redraw(q->o);
        o._0_4_ = 1;
      }
    }
    if ((int)o != 0) {
      set_modflag(1);
    }
  }
  return;
}

Assistant:

void textfont_cb(Fl_Choice* i, void* v) {
  Fl_Font n; int s; Fl_Color c;
  if (v == LOAD) {
    if (!current_widget->textstuff(0,n,s,c)) {i->deactivate(); return;}
    i->activate();
    if (n > 15) n = FL_HELVETICA;
    i->value(n);
  } else {
    int mod = 0;
    n = (Fl_Font)i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->textstuff(1,n,s,c);
	q->o->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}